

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintStringTo(string *s,ostream *os)

{
  CharFormat CVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *os_local;
  string *s_local;
  
  pcVar2 = (char *)std::__cxx11::string::data();
  sVar3 = std::__cxx11::string::size();
  CVar1 = PrintCharsAsStringTo<char>(pcVar2,sVar3,os);
  if ((CVar1 == kHexEscape) && ((FLAGS_gtest_print_utf8 & 1) != 0)) {
    pcVar2 = (char *)std::__cxx11::string::data();
    sVar3 = std::__cxx11::string::size();
    anon_unknown_37::ConditionalPrintAsText(pcVar2,sVar3,os);
  }
  return;
}

Assistant:

void PrintStringTo(const ::std::string& s, ostream* os) {
  if (PrintCharsAsStringTo(s.data(), s.size(), os) == kHexEscape) {
    if (GTEST_FLAG_GET(print_utf8)) {
      ConditionalPrintAsText(s.data(), s.size(), os);
    }
  }
}